

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::StringMaker<std::tuple<int>_>::convert(tuple<int> *in)

{
  ostream *poVar1;
  __tuple_element_t<0UL,_tuple<int>_> *p_Var2;
  String *in_RDI;
  ostringstream oss;
  String *this;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  this = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"(");
  p_Var2 = std::get<0ul,int>((tuple<int> *)0x160aa8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*p_Var2);
  std::operator<<(poVar1,")");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::c_str();
  String::String(this,(char *)in_RDI);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return this;
}

Assistant:

static String convert(const std::tuple<T>& in)
  {
    std::ostringstream oss;
    oss << "(" << std::get<0>(in) << ")";
    return oss.str().c_str();
  }